

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cms_test.cc
# Opt level: O0

int test_create_sql_metrics(void)

{
  code *pcVar1;
  char *__s;
  CmsCreateSqlMetricsRequestType *pCVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1e9;
  int ret;
  HttpTestListener *local_1c8;
  HttpTestListener *listener;
  string local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [55];
  allocator<char> local_131;
  string local_130 [32];
  CmsCreateSqlMetricsRequestType *local_110;
  Cms *cms;
  CmsCreateSqlMetricsResponseType resp;
  CmsCreateSqlMetricsRequestType req;
  
  aliyun::CmsCreateSqlMetricsRequestType::CmsCreateSqlMetricsRequestType
            ((CmsCreateSqlMetricsRequestType *)((long)&resp.result.field_2 + 8));
  aliyun::CmsCreateSqlMetricsResponseType::CmsCreateSqlMetricsResponseType
            ((CmsCreateSqlMetricsResponseType *)&cms);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"cn-hangzhou",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"my_appid",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"my_secret",&local_191);
  pCVar2 = (CmsCreateSqlMetricsRequestType *)
           aliyun::Cms::CreateCmsClient(local_130,local_168,local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  local_110 = pCVar2;
  if (pCVar2 == (CmsCreateSqlMetricsRequestType *)0x0) {
    aliyun::CmsCreateSqlMetricsResponseType::~CmsCreateSqlMetricsResponseType
              ((CmsCreateSqlMetricsResponseType *)&cms);
    aliyun::CmsCreateSqlMetricsRequestType::~CmsCreateSqlMetricsRequestType
              ((CmsCreateSqlMetricsRequestType *)((long)&resp.result.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Cms::SetProxyHost((Cms *)pCVar2,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Cms::SetUseTls((Cms *)local_110,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_create_sql_metrics_response;
  local_1c8 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1e9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1e9);
  HttpTestListener::Start(local_1c8);
  std::__cxx11::string::operator=((string *)(resp.result.field_2._M_local_buf + 8),"ProjectName");
  std::__cxx11::string::operator=((string *)(req.project_name.field_2._M_local_buf + 8),"Sql");
  std::__cxx11::string::operator=((string *)(req.sql.field_2._M_local_buf + 8),"IsPublic");
  aliyun::Cms::CreateSqlMetrics
            (local_110,(CmsCreateSqlMetricsResponseType *)((long)&resp.result.field_2 + 8),
             (CmsErrorInfo *)&cms);
  HttpTestListener::WaitComplete(local_1c8);
  pHVar3 = local_1c8;
  if (local_1c8 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1c8);
    operator_delete(pHVar3,0x180);
  }
  pCVar2 = local_110;
  if (local_110 != (CmsCreateSqlMetricsRequestType *)0x0) {
    aliyun::Cms::~Cms((Cms *)local_110);
    operator_delete(pCVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_create_sql_metrics() {
  CmsCreateSqlMetricsRequestType req;
  CmsCreateSqlMetricsResponseType resp;
  Cms* cms = Cms::CreateCmsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!cms) return 0;
  cms->SetProxyHost("127.0.0.1:12234");
  cms->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_create_sql_metrics_response);
  listener->Start();
  req.project_name = "ProjectName";
  req.sql = "Sql";
  req.is_public = "IsPublic";
  int ret = cms->CreateSqlMetrics(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete cms;
}